

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall booster::log::sinks::syslog::syslog(syslog *this,int __pri,char *__fmt,...)

{
  data *pdVar1;
  data *in_stack_ffffffffffffffc0;
  
  sink::sink((sink *)in_stack_ffffffffffffffc0);
  (this->super_sink)._vptr_sink = (_func_int **)&PTR_log_002e8cd8;
  pdVar1 = (data *)operator_new(0x28);
  data::data(in_stack_ffffffffffffffc0);
  hold_ptr<booster::log::sinks::syslog::data>::hold_ptr(&this->d,pdVar1);
  pdVar1 = hold_ptr<booster::log::sinks::syslog::data>::operator->(&this->d);
  pdVar1->log_was_opened = true;
  openlog((char *)0x0,__pri,(int)__fmt);
  return;
}

Assistant:

syslog::syslog(int opts,int facility) : 
			d(new data())
		{
			d->log_was_opened = true;
			openlog(NULL,opts,facility);
		}